

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O0

case_insensitive_set_t * __thiscall
duckdb::StarExpression::SerializedExcludeList_abi_cxx11_(StarExpression *this)

{
  bool bVar1;
  long in_RSI;
  case_insensitive_set_t *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  value_type *entry;
  const_iterator __end1;
  const_iterator __begin1;
  qualified_column_set_t *__range1;
  case_insensitive_set_t *result;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  case_insensitive_set_t *this_00;
  _Node_iterator_base<duckdb::QualifiedColumnName,_true> local_30;
  _Node_iterator_base<duckdb::QualifiedColumnName,_true> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0xec03e5);
  local_20 = in_RSI + 0x58;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
       ::begin((unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
       ::end((unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
              *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while (bVar1 = ::std::__detail::operator!=(&local_28,&local_30), bVar1) {
    ::std::__detail::_Node_const_iterator<duckdb::QualifiedColumnName,_true,_true>::operator*
              ((_Node_const_iterator<duckdb::QualifiedColumnName,_true,_true> *)0xec0433);
    bVar1 = QualifiedColumnName::IsQualified
                      ((QualifiedColumnName *)in_stack_ffffffffffffff80._M_cur);
    if (!bVar1) {
      pVar2 = ::std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this_00,(value_type *)CONCAT17(bVar1,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff80._M_cur =
           (__node_type *)
           pVar2.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
    }
    ::std::__detail::_Node_const_iterator<duckdb::QualifiedColumnName,_true,_true>::operator++
              ((_Node_const_iterator<duckdb::QualifiedColumnName,_true,_true> *)
               in_stack_ffffffffffffff80._M_cur);
  }
  return in_RDI;
}

Assistant:

case_insensitive_set_t StarExpression::SerializedExcludeList() const {
	// we serialize non-qualified elements in a separate list of only column names for backwards compatibility
	case_insensitive_set_t result;
	for (auto &entry : exclude_list) {
		if (!entry.IsQualified()) {
			result.insert(entry.column);
		}
	}
	return result;
}